

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O2

ssize_t __thiscall vox::nGRP::write(nGRP *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  FILE *__n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  FILE *__s;
  int32_t id;
  size_t childSize;
  size_t contentSize;
  
  __s = (FILE *)CONCAT44(in_register_00000034,__fd);
  id = 0x5052476e;
  fwrite(&id,4,1,__s);
  contentSize = getSize(this);
  fwrite(&contentSize,4,1,__s);
  childSize = 0;
  fwrite(&childSize,4,1,__s);
  __n_00 = __s;
  fwrite(this,4,1,__s);
  DICT::write(&this->nodeAttribs,__fd,__buf_00,(size_t)__n_00);
  fwrite(&this->nodeChildrenNodes,4,1,__s);
  sVar1 = fwrite((this->childNodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,4,(long)this->nodeChildrenNodes,__s);
  return sVar1;
}

Assistant:

void nGRP::write(FILE* fp) {
    // chunk header
    int32_t id = GetMVID('n', 'G', 'R', 'P');
    fwrite(&id, sizeof(int32_t), 1, fp);
    size_t contentSize = getSize();
    fwrite(&contentSize, sizeof(int32_t), 1, fp);
    size_t childSize = 0;
    fwrite(&childSize, sizeof(int32_t), 1, fp);

    // datas's
    fwrite(&nodeId, sizeof(int32_t), 1, fp);
    nodeAttribs.write(fp);
    fwrite(&nodeChildrenNodes, sizeof(int32_t), 1, fp);
    fwrite(childNodes.data(), sizeof(int32_t), nodeChildrenNodes, fp);
}